

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_listener.cpp
# Opt level: O0

int __thiscall zmq::tipc_listener_t::set_local_address(tipc_listener_t *this,char *addr_)

{
  bool bVar1;
  int iVar2;
  fd_t fVar3;
  zmq_socklen_t zVar4;
  socklen_t sVar5;
  int iVar6;
  sockaddr *psVar7;
  int *piVar8;
  stream_listener_base_t *in_RDI;
  int err;
  zmq_socklen_t sl;
  sockaddr_storage ss;
  sockaddr_tipc *a;
  int rc;
  undefined8 in_stack_fffffffffffffec0;
  socket_base_t *this_00;
  sockaddr_storage *in_stack_fffffffffffffec8;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  socket_end_t in_stack_fffffffffffffed0;
  fd_t in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffef0;
  tipc_address_t *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff08;
  _func_int **local_c0;
  ctx_t *local_b8;
  uint32_t local_b0;
  
  sVar5 = (socklen_t)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  iVar2 = tipc_address_t::resolve(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (iVar2 != 0) {
    return -1;
  }
  psVar7 = tipc_address_t::addr((tipc_address_t *)(in_RDI + 1));
  bVar1 = tipc_address_t::is_random((tipc_address_t *)(in_RDI + 1));
  if ((!bVar1) && (psVar7->sa_data[0] == '\x03')) {
    piVar8 = __errno_location();
    *piVar8 = 0x16;
    return -1;
  }
  fVar3 = open_socket(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                      (int)in_stack_fffffffffffffec8);
  in_RDI->_s = fVar3;
  if (in_RDI->_s == -1) {
    return -1;
  }
  bVar1 = tipc_address_t::is_random((tipc_address_t *)(in_RDI + 1));
  if (bVar1) {
    iVar2 = 0;
    zVar4 = get_socket_address(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                               in_stack_fffffffffffffec8);
    if (zVar4 == 0) goto LAB_002f2c75;
    tipc_address_t::tipc_address_t
              ((tipc_address_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (sockaddr *)in_stack_fffffffffffffec8,sVar5);
    in_RDI[1].super_own_t.super_object_t._vptr_object_t = local_c0;
    in_RDI[1].super_own_t.super_object_t._ctx = local_b8;
    in_RDI[1].super_own_t.super_object_t._tid = local_b0;
  }
  tipc_address_t::to_string((tipc_address_t *)ss.__ss_align,(string *)ss.__ss_padding._110_8_);
  bVar1 = tipc_address_t::is_service((tipc_address_t *)(in_RDI + 1));
  if (bVar1) {
    in_stack_fffffffffffffed4 = in_RDI->_s;
    psVar7 = tipc_address_t::addr((tipc_address_t *)(in_RDI + 1));
    sVar5 = tipc_address_t::addrlen((tipc_address_t *)(in_RDI + 1));
    iVar6 = bind(in_stack_fffffffffffffed4,(sockaddr *)psVar7,sVar5);
    iVar2 = (int)psVar7;
    if (iVar6 != 0) goto LAB_002f2c75;
  }
  iVar2 = (in_RDI->super_own_t).options.backlog;
  iVar6 = listen(in_RDI->_s,iVar2);
  if (iVar6 == 0) {
    this_00 = in_RDI->_socket;
    endpoint_uri_pair_ = (endpoint_uri_pair_t *)&stack0xfffffffffffffef8;
    make_unconnected_bind_endpoint_pair((string *)in_stack_ffffffffffffff08);
    socket_base_t::event_listening
              ((socket_base_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               endpoint_uri_pair_,(fd_t)((ulong)this_00 >> 0x20));
    endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)this_00);
    return 0;
  }
LAB_002f2c75:
  piVar8 = __errno_location();
  iVar6 = *piVar8;
  stream_listener_base_t::close(in_RDI,iVar2);
  piVar8 = __errno_location();
  *piVar8 = iVar6;
  return -1;
}

Assistant:

int zmq::tipc_listener_t::set_local_address (const char *addr_)
{
    // Convert str to address struct
    int rc = _address.resolve (addr_);
    if (rc != 0)
        return -1;

    // Cannot bind non-random Port Identity
    const sockaddr_tipc *const a =
      reinterpret_cast<const sockaddr_tipc *> (_address.addr ());
    if (!_address.is_random () && a->addrtype == TIPC_ADDR_ID) {
        errno = EINVAL;
        return -1;
    }

    //  Create a listening socket.
    _s = open_socket (AF_TIPC, SOCK_STREAM, 0);
    if (_s == retired_fd)
        return -1;

    // If random Port Identity, update address object to reflect the assigned address
    if (_address.is_random ()) {
        struct sockaddr_storage ss;
        const zmq_socklen_t sl = get_socket_address (_s, socket_end_local, &ss);
        if (sl == 0)
            goto error;

        _address =
          tipc_address_t (reinterpret_cast<struct sockaddr *> (&ss), sl);
    }


    _address.to_string (_endpoint);

    //  Bind the socket to tipc name
    if (_address.is_service ()) {
#ifdef ZMQ_HAVE_VXWORKS
        rc = bind (_s, (sockaddr *) address.addr (), address.addrlen ());
#else
        rc = bind (_s, _address.addr (), _address.addrlen ());
#endif
        if (rc != 0)
            goto error;
    }

    //  Listen for incoming connections.
    rc = listen (_s, options.backlog);
    if (rc != 0)
        goto error;

    _socket->event_listening (make_unconnected_bind_endpoint_pair (_endpoint),
                              _s);
    return 0;

error:
    int err = errno;
    close ();
    errno = err;
    return -1;
}